

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cShadingLanguage420PackTests.cpp
# Opt level: O3

void __thiscall
gl4cts::GLSL420Pack::QualifierOrderFunctionInputTest::prepareUniforms
          (QualifierOrderFunctionInputTest *this,program *program)

{
  Utils::program::uniform(program,"uni_fs_test",FLOAT,1,4,prepareUniforms::float_data);
  Utils::program::uniform(program,"uni_gs_test",FLOAT,1,4,prepareUniforms::float_data);
  Utils::program::uniform(program,"uni_tcs_test",FLOAT,1,4,prepareUniforms::float_data);
  Utils::program::uniform(program,"uni_tes_test",FLOAT,1,4,prepareUniforms::float_data);
  Utils::program::uniform(program,"uni_vs_test",FLOAT,1,4,prepareUniforms::float_data);
  return;
}

Assistant:

void QualifierOrderFunctionInputTest::prepareUniforms(Utils::program& program)
{
	static const GLfloat float_data[4] = { 1.0f, 1.0f, 0.0f, 0.0f };

	program.uniform("uni_fs_test", Utils::FLOAT, 1 /* n_cols */, 4 /* n_rows */, float_data);
	program.uniform("uni_gs_test", Utils::FLOAT, 1 /* n_cols */, 4 /* n_rows */, float_data);
	program.uniform("uni_tcs_test", Utils::FLOAT, 1 /* n_cols */, 4 /* n_rows */, float_data);
	program.uniform("uni_tes_test", Utils::FLOAT, 1 /* n_cols */, 4 /* n_rows */, float_data);
	program.uniform("uni_vs_test", Utils::FLOAT, 1 /* n_cols */, 4 /* n_rows */, float_data);
}